

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__pattern;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  char *local_40 [2];
  AssertionResult local_30;
  
  pcVar2 = strdup(regex);
  *(char **)this = pcVar2;
  sVar3 = strlen(regex);
  pcVar2 = (char *)operator_new__(sVar3 + 10);
  snprintf(pcVar2,sVar3 + 10,"^(%s)$",regex);
  iVar1 = regcomp((regex_t *)(this + 0x10),pcVar2,1);
  local_30.success_ = iVar1 == 0;
  this[8] = (RE)local_30.success_;
  if (local_30.success_) {
    __pattern = "()";
    if (*regex != '\0') {
      __pattern = regex;
    }
    iVar1 = regcomp((regex_t *)(this + 0x50),__pattern,1);
    local_30.success_ = iVar1 == 0;
    this[8] = (RE)local_30.success_;
    local_30.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_30.success_) goto LAB_0011e638;
  }
  local_30.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  Message::Message((Message *)&local_50);
  poVar4 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Regular expression \"",0x14);
  if (regex == (char *)0x0) {
    sVar5.ptr_ = local_50.ptr_ + 0x10;
    sVar3 = 6;
    regex = "(null)";
  }
  else {
    sVar5.ptr_ = local_50.ptr_;
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_50.ptr_ + 0x10);
    }
    sVar3 = strlen(regex);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,regex,sVar3);
  poVar4 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\" is not a valid POSIX Extended regular expression.",0x33);
  GetBoolAssertionFailureMessage((internal *)local_40,&local_30,"is_valid_","false","true");
  AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-port.cc"
             ,0xa7,local_40[0]);
  AssertHelper::operator=(&local_48,(Message *)&local_50);
  AssertHelper::~AssertHelper(&local_48);
  if (local_40[0] != (char *)0x0) {
    operator_delete__(local_40[0]);
  }
  if (local_50.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50.ptr_ + 8))();
  }
LAB_0011e638:
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  operator_delete__(pcVar2);
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}